

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimd.cpp
# Opt level: O0

qsizetype qRandomCpu(void *buffer,qsizetype count)

{
  uint64_t uVar1;
  uint *puVar2;
  long in_RSI;
  uint *in_RDI;
  uint *end;
  uint *ptr;
  uint *local_18;
  
  uVar1 = qCpuFeatures();
  local_18 = in_RDI;
  if ((uVar1 & 0x20000) == 0x20000) {
    local_18 = qt_random_rdseed(in_RDI,in_RDI + in_RSI);
  }
  puVar2 = qt_random_rdrnd(local_18,in_RDI + in_RSI);
  return (long)puVar2 - (long)in_RDI >> 2;
}

Assistant:

qsizetype qRandomCpu(void *buffer, qsizetype count) noexcept
{
    unsigned *ptr = reinterpret_cast<unsigned *>(buffer);
    unsigned *end = ptr + count;

    if (qCpuHasFeature(RDSEED))
        ptr = qt_random_rdseed(ptr, end);

    // fill the buffer with RDRND if RDSEED didn't
    ptr = qt_random_rdrnd(ptr, end);
    return ptr - reinterpret_cast<unsigned *>(buffer);
}